

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

size_t __thiscall
nodecpp::log::SkippedMsgCounters::toStr(SkippedMsgCounters *this,char *buff,size_t sz)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  SkippedMsgCounters *args_1;
  ulong uVar4;
  format_to_n_result<char_*> fVar5;
  char *local_440;
  char local_438 [1020];
  undefined2 local_3c;
  undefined1 local_3a;
  char local_39 [9];
  
  if (sz < 0x80) {
    assert::onAssertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/src/log.cpp"
               ,0xdb,"sz >= reportMaxSize",true);
  }
  builtin_strncpy(buff,"<skipped:",9);
  uVar4 = 9;
  bVar1 = false;
  args_1 = this;
  for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 8) {
    if ((args_1->skippedCtrs[0] != 0) && (uVar4 <= sz && sz - uVar4 != 0)) {
      fVar5 = fmt::v7::format_to_n<char_*,_char[8],_const_char_*,_unsigned_int,_0>
                        (buff + uVar4,sz - uVar4,(char (*) [8])"{}:{}, ",
                         (char **)(LogLevelNames + lVar3),args_1->skippedCtrs);
      uVar4 = uVar4 + fVar5.size;
      bVar1 = true;
    }
    args_1 = (SkippedMsgCounters *)(args_1->skippedCtrs + 1);
  }
  if (bVar1) {
    (buff + (uVar4 - 2))[0] = '>';
    (buff + (uVar4 - 2))[1] = '\n';
  }
  else {
    local_440 = "indeed: {}";
    if (this->fullCnt_ != 0) {
      fVar5 = fmt::v7::format_to_n<char_*,_const_char_*,_unsigned_int,_0>
                        (local_438,0x3ff,&local_440,&this->fullCnt_);
      if (fVar5.size < 0x400) {
        pcVar2 = local_438 + fVar5.size;
      }
      else {
        pcVar2 = local_39;
        local_3c = 0x2e2e;
        local_3a = 0x2e;
      }
      *pcVar2 = '\0';
      assert::onAssertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/src/log.cpp"
                 ,0xee,"fullCnt_ == 0",local_438,true);
    }
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

size_t SkippedMsgCounters::toStr( char* buff, size_t sz) {
		NODECPP_ASSERT( foundation::module_id, ::nodecpp::assert::AssertLevel::critical, sz >= reportMaxSize ); 
		memcpy( buff, "<skipped: ", 9 );
		size_t pos = 9;
		bool added = false;
		for ( size_t i=0; i<log_level_count; ++i )
			if ( skippedCtrs[i] && pos < sz )					
			{
				auto r = ::fmt::format_to_n( buff + pos, sz - pos, "{}:{}, ", LogLevelNames[i], skippedCtrs[i] );
				pos += r.size;
				added = true;
			}
		if ( added )
		{
			buff[pos - 2] = '>';
			buff[pos - 1] = '\n';
			return pos;
		}
		else
		{
			NODECPP_ASSERT( foundation::module_id, ::nodecpp::assert::AssertLevel::critical, fullCnt_ == 0, "indeed: {}", fullCnt_ ); 
			return 0;
		}
	}